

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O3

int aom_satd_lp_avx2(int16_t *coeff,int length)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar5 [32];
  undefined1 auVar4 [64];
  
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  auVar3 = auVar4._0_32_;
  if (0 < length) {
    lVar2 = 0;
    auVar5._8_2_ = 1;
    auVar5._0_8_ = 0x1000100010001;
    auVar5._10_2_ = 1;
    auVar5._12_2_ = 1;
    auVar5._14_2_ = 1;
    auVar5._16_2_ = 1;
    auVar5._18_2_ = 1;
    auVar5._20_2_ = 1;
    auVar5._22_2_ = 1;
    auVar5._24_2_ = 1;
    auVar5._26_2_ = 1;
    auVar5._28_2_ = 1;
    auVar5._30_2_ = 1;
    do {
      auVar3 = vpabsw_avx2(*(undefined1 (*) [32])(coeff + lVar2));
      auVar3 = vpmaddwd_avx2(auVar3,auVar5);
      auVar3 = vpaddd_avx2(auVar3,auVar4._0_32_);
      auVar4 = ZEXT3264(auVar3);
      lVar2 = lVar2 + 0x10;
    } while ((int)lVar2 < length);
  }
  auVar5 = vpsrldq_avx2(auVar3,8);
  auVar3 = vpaddd_avx2(auVar5,auVar3);
  auVar5 = vpsrlq_avx2(auVar3,0x20);
  auVar3 = vpaddd_avx2(auVar3,auVar5);
  auVar1 = vpaddd_avx(auVar3._16_16_,auVar3._0_16_);
  return auVar1._0_4_;
}

Assistant:

int aom_satd_lp_avx2(const int16_t *coeff, int length) {
  const __m256i one = _mm256_set1_epi16(1);
  __m256i accum = _mm256_setzero_si256();

  for (int i = 0; i < length; i += 16) {
    const __m256i src_line = _mm256_loadu_si256((const __m256i *)coeff);
    const __m256i abs = _mm256_abs_epi16(src_line);
    const __m256i sum = _mm256_madd_epi16(abs, one);
    accum = _mm256_add_epi32(accum, sum);
    coeff += 16;
  }

  {  // 32 bit horizontal add
    const __m256i a = _mm256_srli_si256(accum, 8);
    const __m256i b = _mm256_add_epi32(accum, a);
    const __m256i c = _mm256_srli_epi64(b, 32);
    const __m256i d = _mm256_add_epi32(b, c);
    const __m128i accum_128 = _mm_add_epi32(_mm256_castsi256_si128(d),
                                            _mm256_extractf128_si256(d, 1));
    return _mm_cvtsi128_si32(accum_128);
  }
}